

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t format_numeric_keypad_key(char *buf,Terminal *term,char key,_Bool shift,_Bool ctrl)

{
  int iVar1;
  byte local_31;
  uint local_30;
  byte local_2a;
  wchar_t xkey;
  char c;
  _Bool app_keypad;
  char *p;
  _Bool ctrl_local;
  _Bool shift_local;
  char key_local;
  Terminal *term_local;
  char *buf_local;
  
  local_31 = 0;
  if ((term->app_keypad_keys & 1U) != 0) {
    local_31 = term->no_applic_k ^ 0xff;
  }
  if ((((term->nethack_keypad & 1U) == 0) || (key < '1')) || ('9' < key)) {
    local_30 = 0;
    if ((term->funky_type == L'\x03') || ((term->funky_type < L'\x02' && ((local_31 & 1) != 0)))) {
      switch(key) {
      case '*':
        local_30 = 0x52;
        break;
      case '-':
        local_30 = 0x53;
        break;
      case '/':
        local_30 = 0x51;
        break;
      case 'G':
        local_30 = 0x50;
      }
    }
    if ((local_31 & 1) != 0) {
      switch(key) {
      case '\r':
        local_30 = 0x4d;
        break;
      case '*':
        if (term->funky_type == L'\x02') {
          local_30 = 0x6a;
        }
        break;
      case '+':
        if (term->funky_type == L'\x02') {
          local_30 = 0x6b;
          if (shift) {
            local_30 = 0x6c;
          }
        }
        else {
          local_30 = 0x6c;
          if (shift) {
            local_30 = 0x6d;
          }
        }
        break;
      case '-':
        if (term->funky_type == L'\x02') {
          local_30 = 0x6d;
        }
        break;
      case '.':
        local_30 = 0x6e;
        break;
      case '/':
        if (term->funky_type == L'\x02') {
          local_30 = 0x6f;
        }
        break;
      case '0':
        local_30 = 0x70;
        break;
      case '1':
        local_30 = 0x71;
        break;
      case '2':
        local_30 = 0x72;
        break;
      case '3':
        local_30 = 0x73;
        break;
      case '4':
        local_30 = 0x74;
        break;
      case '5':
        local_30 = 0x75;
        break;
      case '6':
        local_30 = 0x76;
        break;
      case '7':
        local_30 = 0x77;
        break;
      case '8':
        local_30 = 0x78;
        break;
      case '9':
        local_30 = 0x79;
      }
    }
    _xkey = buf;
    if (local_30 != 0) {
      if ((term->vt52_mode & 1U) == 0) {
        iVar1 = sprintf(buf,"\x1bO%c",(ulong)local_30);
      }
      else if ((local_30 < 0x50) || (0x53 < local_30)) {
        iVar1 = sprintf(buf,"\x1b?%c",(ulong)local_30);
      }
      else {
        iVar1 = sprintf(buf,"\x1b%c",(ulong)local_30);
      }
      _xkey = buf + iVar1;
    }
  }
  else {
    local_2a = "bjnh.lyku"[key + -0x31];
    if ((ctrl) && (local_2a != 0x2e)) {
      local_2a = local_2a & 0x1f;
    }
    else if ((shift) && (local_2a != 0x2e)) {
      local_2a = local_2a - 0x20;
    }
    xkey = (int)buf + L'\x01';
    *buf = local_2a;
  }
  return xkey - (int)buf;
}

Assistant:

int format_numeric_keypad_key(char *buf, Terminal *term, char key,
                              bool shift, bool ctrl)
{
    char *p = buf;
    bool app_keypad = (term->app_keypad_keys && !term->no_applic_k);

    if (term->nethack_keypad && (key >= '1' && key <= '9')) {
        static const char nh_base[] = "bjnh.lyku";
        char c = nh_base[key - '1'];
        if (ctrl && c != '.')
            c &= 0x1F;
        else if (shift && c != '.')
            c += 'A'-'a';
        *p++ = c;
    } else {
        int xkey = 0;

        if (term->funky_type == FUNKY_VT400 ||
            (term->funky_type <= FUNKY_LINUX && app_keypad)) {
            switch (key) {
              case 'G': xkey = 'P'; break;
              case '/': xkey = 'Q'; break;
              case '*': xkey = 'R'; break;
              case '-': xkey = 'S'; break;
            }
        }

        if (app_keypad) {
            switch (key) {
              case '0': xkey = 'p'; break;
              case '1': xkey = 'q'; break;
              case '2': xkey = 'r'; break;
              case '3': xkey = 's'; break;
              case '4': xkey = 't'; break;
              case '5': xkey = 'u'; break;
              case '6': xkey = 'v'; break;
              case '7': xkey = 'w'; break;
              case '8': xkey = 'x'; break;
              case '9': xkey = 'y'; break;
              case '.': xkey = 'n'; break;
              case '\r': xkey = 'M'; break;

              case '+':
                /*
                 * Keypad + is tricky. It covers a space that would
                 * be taken up on the VT100 by _two_ keys; so we
                 * let Shift select between the two. Worse still,
                 * in xterm function key mode we change which two...
                 */
                if (term->funky_type == FUNKY_XTERM)
                    xkey = shift ? 'l' : 'k';
                else
                    xkey = shift ? 'm' : 'l';
                break;

              case '/':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'o';
                break;
              case '*':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'j';
                break;
              case '-':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'm';
                break;
            }
        }

        if (xkey) {
            if (term->vt52_mode) {
                if (xkey >= 'P' && xkey <= 'S')
                    p += sprintf(p, "\x1B%c", xkey);
                else
                    p += sprintf(p, "\x1B?%c", xkey);
            } else
                p += sprintf(p, "\x1BO%c", xkey);
        }
    }

    return p - buf;
}